

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  curl_slist *pcVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  char in_AL;
  int iVar10;
  long *plVar11;
  long *plVar12;
  void **ppvVar13;
  char *pcVar14;
  size_t sVar15;
  void *pvVar16;
  ulong uVar17;
  curl_httppost *pcVar18;
  uint uVar19;
  undefined8 in_RCX;
  long lVar20;
  curl_httppost *pcVar21;
  undefined8 in_RDX;
  curl_httppost **ppcVar22;
  int *piVar23;
  char *pcVar24;
  size_t sVar25;
  undefined8 in_R8;
  long *plVar26;
  undefined8 in_R9;
  CURLFORMcode CVar27;
  FormInfo *ptr;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_140;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar19 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar11 = (long *)(*Curl_ccalloc)(1,0x68);
  if (plVar11 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  bVar8 = false;
  pcVar24 = (char *)0x0;
  piVar23 = (int *)0x0;
  CVar27 = CURL_FORMADD_OK;
  plVar26 = plVar11;
switchD_0061fe12_caseD_9:
  bVar9 = bVar8;
  do {
    bVar8 = bVar9;
    plVar12 = plVar11;
    if (CVar27 != CURL_FORMADD_OK) goto LAB_00620567;
    if ((!bVar8) || (piVar23 == (int *)0x0)) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      iVar10 = *(int *)ppvVar13;
      if (iVar10 == 0x11) goto LAB_0062060e;
      break;
    }
    iVar10 = *piVar23;
    pcVar24 = *(char **)(piVar23 + 2);
    piVar23 = piVar23 + 4;
    CVar27 = CURL_FORMADD_OK;
    bVar9 = false;
  } while (iVar10 == 0x11);
  CVar27 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar24;
  switch(iVar10) {
  case 1:
    goto switchD_0061fe12_caseD_1;
  case 2:
    *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 4;
switchD_0061fe12_caseD_1:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar26 == 0) {
      if (!bVar8) {
        uVar17 = (ulong)uVar19;
        if (uVar17 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar17);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar13;
      }
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        *plVar26 = (long)pcVar14;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0061fe12_caseD_9;
  case 3:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[1] == 0) {
      if (!bVar8) {
        uVar17 = (ulong)uVar19;
        if (uVar17 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar17);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar13;
      }
      plVar26[1] = (long)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_0061fe12_caseD_9;
  case 4:
    goto switchD_0061fe12_caseD_4;
  case 5:
    *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 8;
switchD_0061fe12_caseD_4:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[2] != 0) goto switchD_0061fe12_caseD_9;
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_0061fe12_caseD_9;
    break;
  case 6:
    goto switchD_0061fe12_caseD_6;
  case 7:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar26 + 5) & 10) == 0) {
      if (!bVar8) {
        uVar17 = (ulong)uVar19;
        if (uVar17 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar17);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar13;
      }
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        plVar26[2] = (long)pcVar14;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar14 != (char *)0x0) {
          *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 2;
          goto LAB_006204f9;
        }
      }
    }
    goto switchD_0061fe12_caseD_9;
  case 8:
    CVar27 = CURL_FORMADD_ILLEGAL_ARRAY;
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      piVar23 = (int *)*ppvVar13;
      bVar8 = piVar23 != (int *)0x0;
      CVar27 = (uint)(piVar23 == (int *)0x0) * 3;
    }
  default:
    goto switchD_0061fe12_caseD_9;
  case 10:
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    if (plVar26[2] == 0) {
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        plVar26[2] = (long)pcVar14;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar14 != (char *)0x0) {
          *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 1;
LAB_006204f9:
          *(undefined1 *)((long)plVar26 + 0x61) = 1;
          CVar27 = CURL_FORMADD_OK;
        }
      }
    }
    else {
      CVar27 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar26 + 5) & 1) != 0) &&
         (CVar27 = CURL_FORMADD_NULL, pcVar14 != (char *)0x0)) {
        local_140 = (*Curl_cstrdup)(pcVar14);
        CVar27 = CURL_FORMADD_MEMORY;
        if (local_140 != (char *)0x0) {
          plVar12 = (long *)(*Curl_ccalloc)(1,0x68);
          if (plVar12 == (long *)0x0) {
            plVar12 = (long *)0x0;
          }
          else {
            plVar12[2] = (long)local_140;
            plVar12[5] = 1;
            plVar12[0xb] = plVar26[0xb];
            plVar26[0xb] = (long)plVar12;
          }
          if (plVar12 != (long *)0x0) {
            *(undefined1 *)((long)plVar12 + 0x61) = 1;
            goto LAB_00620540;
          }
LAB_0062054b:
          CVar27 = CURL_FORMADD_MEMORY;
          (*Curl_cfree)(local_140);
        }
      }
    }
    goto switchD_0061fe12_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[8] == 0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      plVar26[8] = (long)pcVar14;
      CVar27 = CURL_FORMADD_MEMORY;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)((long)plVar26 + 99) = 1;
        CVar27 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0061fe12_caseD_9;
  case 0xc:
    *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 0x30;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[6] != 0) goto switchD_0061fe12_caseD_9;
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_0061fe12_caseD_9;
    plVar26[6] = (long)pcVar14;
    break;
  case 0xd:
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[7] == 0) {
      if (!bVar8) {
        uVar17 = (ulong)uVar19;
        if (uVar17 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar17);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar13;
      }
      plVar26[7] = (long)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_0061fe12_caseD_9;
  case 0xe:
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    if (plVar26[4] == 0) {
      CVar27 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        plVar26[4] = (long)pcVar14;
        CVar27 = CURL_FORMADD_MEMORY;
        if (pcVar14 != (char *)0x0) {
          *(undefined1 *)((long)plVar26 + 0x62) = 1;
          CVar27 = CURL_FORMADD_OK;
        }
      }
    }
    else {
      CVar27 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar26 + 5) & 1) != 0) &&
         (CVar27 = CURL_FORMADD_NULL, pcVar14 != (char *)0x0)) {
        local_140 = (*Curl_cstrdup)(pcVar14);
        CVar27 = CURL_FORMADD_MEMORY;
        if (local_140 != (char *)0x0) {
          plVar12 = (long *)(*Curl_ccalloc)(1,0x68);
          if (plVar12 == (long *)0x0) {
            plVar12 = (long *)0x0;
          }
          else {
            plVar12[4] = (long)local_140;
            plVar12[5] = 1;
            plVar12[0xb] = plVar26[0xb];
            plVar26[0xb] = (long)plVar12;
          }
          if (plVar12 == (long *)0x0) goto LAB_0062054b;
          *(undefined1 *)((long)plVar12 + 0x62) = 1;
LAB_00620540:
          CVar27 = CURL_FORMADD_OK;
          plVar26 = plVar12;
        }
      }
    }
    goto switchD_0061fe12_caseD_9;
  case 0xf:
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[10] == 0) {
      plVar26[10] = (long)pcVar14;
      CVar27 = CURL_FORMADD_OK;
    }
    goto switchD_0061fe12_caseD_9;
  case 0x13:
    *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 0x40;
    CVar27 = CURL_FORMADD_OPTION_TWICE;
    if (plVar26[9] != 0) goto switchD_0061fe12_caseD_9;
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    CVar27 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_0061fe12_caseD_9;
    plVar26[9] = (long)pcVar14;
    break;
  case 0x14:
    *(byte *)(plVar26 + 5) = *(byte *)(plVar26 + 5) | 0x80;
switchD_0061fe12_caseD_6:
    if (!bVar8) {
      uVar17 = (ulong)uVar19;
      if (uVar17 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar17);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar13;
    }
    plVar26[3] = (long)pcVar14;
    CVar27 = CURL_FORMADD_OK;
    goto switchD_0061fe12_caseD_9;
  }
  plVar26[2] = (long)pcVar14;
  CVar27 = CURL_FORMADD_OK;
  goto switchD_0061fe12_caseD_9;
LAB_00620567:
  do {
    if ((char)plVar12[0xc] == '\x01') {
      (*Curl_cfree)((void *)*plVar12);
      *plVar12 = 0;
      *(undefined1 *)(plVar12 + 0xc) = 0;
    }
    if (*(char *)((long)plVar12 + 0x61) == '\x01') {
      (*Curl_cfree)((void *)plVar12[2]);
      plVar12[2] = 0;
      *(undefined1 *)((long)plVar12 + 0x61) = 0;
    }
    if (*(char *)((long)plVar12 + 0x62) == '\x01') {
      (*Curl_cfree)((void *)plVar12[4]);
      plVar12[4] = 0;
      *(undefined1 *)((long)plVar12 + 0x62) = 0;
    }
    if (*(char *)((long)plVar12 + 99) == '\x01') {
      (*Curl_cfree)((void *)plVar12[8]);
      plVar12[8] = 0;
      *(undefined1 *)((long)plVar12 + 99) = 0;
    }
    plVar26 = plVar12 + 0xb;
    plVar12 = (long *)*plVar26;
  } while ((long *)*plVar26 != (long *)0x0);
  if (CVar27 == CURL_FORMADD_OK) {
LAB_0062060e:
    CVar27 = CURL_FORMADD_OK;
    pcVar24 = (char *)0x0;
    pcVar21 = (curl_httppost *)0x0;
    plVar26 = plVar11;
    do {
      if (*plVar26 == 0) {
        if (pcVar21 != (curl_httppost *)0x0) goto LAB_00620636;
LAB_00620905:
        CVar27 = CURL_FORMADD_INCOMPLETE;
        break;
      }
      if (plVar26[2] == 0 && pcVar21 == (curl_httppost *)0x0) goto LAB_00620905;
LAB_00620636:
      if ((plVar26[3] != 0) && ((*(byte *)(plVar26 + 5) & 1) != 0)) goto LAB_00620905;
      uVar17 = plVar26[5];
      if (((~(uint)uVar17 & 9) == 0) ||
         ((uVar19 = ~(uint)uVar17, (uVar19 & 10) == 0 || ((uVar19 & 0x30) == 0 && plVar26[6] == 0)))
         ) goto LAB_00620905;
      if (((uVar17 & 0x11) != 0) && (plVar26[4] == 0)) {
        plVar12 = plVar26 + 8;
        if ((uVar17 & 0x10) == 0) {
          plVar12 = plVar26 + 2;
        }
        pcVar14 = Curl_mime_contenttype((char *)*plVar12);
        if (pcVar14 == (char *)0x0) {
          pcVar14 = pcVar24;
        }
        if (pcVar14 == (char *)0x0) {
          pcVar14 = "application/octet-stream";
        }
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        plVar26[4] = (long)pcVar14;
        if (pcVar14 == (char *)0x0) {
          CVar27 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)((long)plVar26 + 0x62) = 1;
      }
      pcVar14 = (char *)*plVar26;
      if ((pcVar14 != (char *)0x0) && (plVar26[1] != 0)) {
        lVar20 = 0;
        do {
          if (pcVar14[lVar20] == '\0') {
            CVar27 = CURL_FORMADD_NULL;
            break;
          }
          lVar20 = lVar20 + 1;
        } while (plVar26[1] != lVar20);
        if (CVar27 != CURL_FORMADD_OK) break;
      }
      if ((plVar26 == plVar11) && ((plVar26[5] & 4U) == 0)) {
        if (pcVar14 != (char *)0x0) {
          sVar25 = plVar26[1];
          if (sVar25 == 0) {
            sVar15 = strlen(pcVar14);
            sVar25 = sVar15 + 1;
          }
          pvVar16 = Curl_memdup(pcVar14,sVar25);
          *plVar26 = (long)pvVar16;
        }
        if (*plVar26 != 0) {
          *(undefined1 *)(plVar26 + 0xc) = 1;
          goto LAB_00620758;
        }
LAB_0062090d:
        CVar27 = CURL_FORMADD_MEMORY;
        break;
      }
LAB_00620758:
      if (((*(byte *)(plVar26 + 5) & 0x6b) == 0) &&
         (pcVar14 = (char *)plVar26[2], pcVar14 != (char *)0x0)) {
        sVar25 = plVar26[3];
        if (sVar25 == 0) {
          sVar15 = strlen(pcVar14);
          sVar25 = sVar15 + 1;
        }
        pvVar16 = Curl_memdup(pcVar14,sVar25);
        plVar26[2] = (long)pvVar16;
        if (pvVar16 == (void *)0x0) {
          CVar27 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)((long)plVar26 + 0x61) = 1;
      }
      pcVar14 = (char *)*plVar26;
      uVar17 = plVar26[1];
      pcVar1 = (char *)plVar26[2];
      lVar20 = plVar26[3];
      pcVar2 = (char *)plVar26[6];
      uVar3 = plVar26[7];
      pcVar4 = (char *)plVar26[4];
      uVar5 = plVar26[5];
      pcVar6 = (curl_slist *)plVar26[10];
      pcVar7 = (char *)plVar26[8];
      pvVar16 = (void *)plVar26[9];
      if (pcVar14 != (char *)0x0 && uVar17 == 0) {
        uVar17 = strlen(pcVar14);
      }
      if (((long)(uVar3 | uVar17) < 0) ||
         (pcVar18 = (curl_httppost *)(*Curl_ccalloc)(1,0x70), pcVar18 == (curl_httppost *)0x0)) {
        pcVar18 = (curl_httppost *)0x0;
      }
      else {
        pcVar18->name = pcVar14;
        pcVar18->namelength = uVar17;
        pcVar18->contents = pcVar1;
        pcVar18->contentlen = lVar20;
        pcVar18->buffer = pcVar2;
        pcVar18->bufferlength = uVar3;
        pcVar18->contenttype = pcVar4;
        pcVar18->contentheader = pcVar6;
        pcVar18->showfilename = pcVar7;
        pcVar18->userp = pvVar16;
        pcVar18->flags = uVar5 | 0x80;
        if (pcVar21 == (curl_httppost *)0x0) {
          pcVar21 = *last_post;
          if (*last_post == (curl_httppost *)0x0) {
            pcVar21 = (curl_httppost *)httppost;
          }
          pcVar21->next = pcVar18;
          ppcVar22 = last_post;
        }
        else {
          pcVar18->more = pcVar21->more;
          ppcVar22 = &pcVar21->more;
        }
        *ppcVar22 = pcVar18;
      }
      if (pcVar18 == (curl_httppost *)0x0) goto LAB_0062090d;
      plVar12 = plVar26 + 4;
      plVar26 = (long *)plVar26[0xb];
      if ((char *)*plVar12 != (char *)0x0) {
        pcVar24 = (char *)*plVar12;
      }
      pcVar21 = pcVar18;
    } while (plVar26 != (long *)0x0);
    if (CVar27 == CURL_FORMADD_OK) {
      CVar27 = CURL_FORMADD_OK;
    }
    else {
      for (; plVar26 != (long *)0x0; plVar26 = (long *)plVar26[0xb]) {
        if ((char)plVar26[0xc] == '\x01') {
          (*Curl_cfree)((void *)*plVar26);
          *plVar26 = 0;
          *(undefined1 *)(plVar26 + 0xc) = 0;
        }
        if (*(char *)((long)plVar26 + 0x61) == '\x01') {
          (*Curl_cfree)((void *)plVar26[2]);
          plVar26[2] = 0;
          *(undefined1 *)((long)plVar26 + 0x61) = 0;
        }
        if (*(char *)((long)plVar26 + 0x62) == '\x01') {
          (*Curl_cfree)((void *)plVar26[4]);
          plVar26[4] = 0;
          *(undefined1 *)((long)plVar26 + 0x62) = 0;
        }
        if (*(char *)((long)plVar26 + 99) == '\x01') {
          (*Curl_cfree)((void *)plVar26[8]);
          plVar26[8] = 0;
          *(undefined1 *)((long)plVar26 + 99) = 0;
        }
      }
    }
  }
  do {
    plVar26 = (long *)plVar11[0xb];
    (*Curl_cfree)(plVar11);
    plVar11 = plVar26;
  } while (plVar26 != (long *)0x0);
  return CVar27;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}